

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O0

double __thiscall spdlog::sinks::base_sink<std::mutex>::log(base_sink<std::mutex> *this,double __x)

{
  undefined8 in_RSI;
  double extraout_XMM0_Qa;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)this,in_stack_ffffffffffffffc8);
  (*(this->super_sink)._vptr_sink[6])(this,in_RSI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ae0f5);
  return extraout_XMM0_Qa;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::log(const details::log_msg &msg)
{
    std::lock_guard<Mutex> lock(mutex_);
    sink_it_(msg);
}